

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O2

void LatencyDumpDefaultImpl::addDumpTitle(stringstream *ss,size_t max_name_len)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  
  poVar1 = (ostream *)(ss + 0x10);
  lVar2 = *(long *)(ss + 0x10);
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xffffff4f | 0x20;
  *(long *)(ss + *(long *)(lVar2 + -0x18) + 0x20) = (long)(int)max_name_len;
  poVar4 = std::operator<<(poVar1,"STAT NAME");
  std::operator<<(poVar4,": ");
  lVar2 = *(long *)(ss + 0x10);
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xffffff4f | 0x80;
  *(undefined8 *)(ss + *(long *)(lVar2 + -0x18) + 0x20) = 8;
  poVar4 = std::operator<<(poVar1,"TOTAL");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 7;
  poVar4 = std::operator<<(poVar1,"RATIO");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 6;
  poVar4 = std::operator<<(poVar1,"CALLS");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  poVar4 = std::operator<<(poVar1,"AVERAGE");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  poVar4 = std::operator<<(poVar1,"p50");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  poVar4 = std::operator<<(poVar1,"p99");
  std::operator<<(poVar4," ");
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  std::operator<<(poVar1,"p99.9");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void addDumpTitle(std::stringstream& ss, size_t max_name_len) {
        ss << std::left << std::setw(max_name_len) << "STAT NAME" << ": ";
        ss << std::right;
        ss << std::setw(8) << "TOTAL" << " ";
        ss << std::setw(7) << "RATIO" << " ";
        ss << std::setw(6) << "CALLS" << " ";
        ss << std::setw(8) << "AVERAGE" << " ";
        ss << std::setw(8) << "p50" << " ";
        ss << std::setw(8) << "p99" << " ";
        ss << std::setw(8) << "p99.9";
        ss << std::endl;
    }